

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O1

bool fs_is_file(string_view path)

{
  string_view path_00;
  char cVar1;
  _Bool _Var2;
  bool bVar3;
  char *in_RSI;
  size_t in_RDI;
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  error_code local_50;
  path local_40;
  
  local_50._M_value = 0;
  local_60._M_len = in_RDI;
  local_60._M_str = in_RSI;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_60,auto_format);
  cVar1 = std::filesystem::status(&local_40,&local_50);
  if ((cVar1 != '\x01') || (bVar3 = true, local_50._M_value != 0)) {
    _Var2 = fs_is_msvc();
    if (_Var2) {
      path_00._M_str = local_60._M_str;
      path_00._M_len = local_60._M_len;
      bVar3 = fs_is_appexec_alias(path_00);
    }
    else {
      bVar3 = false;
    }
  }
  std::filesystem::__cxx11::path::~path(&local_40);
  return bVar3;
}

Assistant:

bool
fs_is_file(std::string_view path)
{
  // is path a regular file or a symlink to a regular file.
  // not a directory, device, or symlink to a directory.
  // stat() doesn't detect App Execution Aliases
  // AppExec Alias have FILE_ATTRIBUTE_REPARSE_POINT | FILE_ATTRIBUTE_ARCHIVE
  // but need to check the reparse point data for IO_REPARSE_TAG_APPEXECLINK

  bool ok;
#if defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = (std::filesystem::is_regular_file(path, ec) && !ec) ||
        (fs_is_msvc() && fs_is_appexec_alias(path));
#elif defined(_WIN32)
  ok = fs_win32_is_type(path, FILE_TYPE_DISK) || fs_is_appexec_alias(path);
#else
  ok = S_ISREG(fs_st_mode(path));
#endif

  return ok;
}